

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O1

DdNode * Cudd_bddIteConstant(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  bool bVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint *puVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  DdNode *h_00;
  DdNode *g_1;
  DdNode *pDVar13;
  DdNode *pDVar14;
  DdNode *g_00;
  bool bVar15;
  byte local_50;
  ulong local_40;
  
  pDVar3 = dd->one;
  if (pDVar3 == f) {
    return g;
  }
  pDVar14 = (DdNode *)((ulong)pDVar3 ^ 1);
  if (pDVar14 == f) {
    return h;
  }
  g_00 = g;
  if ((DdNode *)((ulong)g ^ 1) == f) {
    g_00 = pDVar14;
  }
  if (g == f) {
    g_00 = pDVar3;
  }
  h_00 = h;
  if ((DdNode *)((ulong)h ^ 1) == f) {
    h_00 = pDVar3;
  }
  if (h == f) {
    h_00 = pDVar14;
  }
  if (g_00 == h_00) {
    return g_00;
  }
  pDVar4 = (DdNode *)((ulong)g_00 & 0xfffffffffffffffe);
  uVar11 = pDVar4->index;
  if (((ulong)uVar11 == 0x7fffffff) && (*(int *)((ulong)h_00 & 0xfffffffffffffffe) == 0x7fffffff)) {
    return (DdNode *)0x1;
  }
  pDVar13 = (DdNode *)0x1;
  if (g_00 == (DdNode *)((ulong)h_00 ^ 1)) {
    return (DdNode *)0x1;
  }
  puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar10 = 0x7fffffff;
  uVar12 = 0x7fffffff;
  if ((ulong)*puVar7 != 0x7fffffff) {
    uVar12 = dd->perm[*puVar7];
  }
  pDVar9 = (DdNode *)((ulong)h_00 & 0xfffffffffffffffe);
  if (uVar11 != 0x7fffffff) {
    uVar10 = dd->perm[uVar11];
  }
  uVar11 = 0x7fffffff;
  if ((ulong)pDVar9->index != 0x7fffffff) {
    uVar11 = dd->perm[pDVar9->index];
  }
  pDVar5 = f;
  pDVar8 = g_00;
  pDVar6 = h_00;
  if (pDVar3 == pDVar4) {
    if (uVar12 <= uVar11) {
      bVar1 = false;
      if (uVar12 != uVar11) goto LAB_007c198b;
      if ((long)((ulong)((uint)f & 1) + *(long *)(puVar7 + 8) * 2) <=
          (long)((ulong)((uint)h_00 & 1) + pDVar9->Id * 2)) goto LAB_007c1a5d;
    }
    pDVar5 = (DdNode *)((ulong)h_00 ^ 1);
    pDVar6 = (DdNode *)((ulong)f ^ 1);
    if (g_00 == pDVar3) {
      pDVar5 = h_00;
      pDVar6 = f;
    }
    bVar1 = true;
    goto LAB_007c1a5d;
  }
  bVar1 = false;
  if (pDVar3 == pDVar9) {
    if (uVar12 <= uVar10) {
      if (uVar12 != uVar10) goto LAB_007c198b;
      if ((long)((ulong)((uint)f & 1) + *(long *)(puVar7 + 8) * 2) <=
          (long)((ulong)((uint)g_00 & 1) + pDVar4->Id * 2)) goto LAB_007c1a5d;
    }
    pDVar5 = (DdNode *)((ulong)g_00 ^ 1);
    pDVar8 = (DdNode *)((ulong)f ^ 1);
    if (h_00 != pDVar3) {
      pDVar5 = g_00;
      pDVar8 = f;
    }
    bVar1 = true;
  }
  else {
LAB_007c198b:
    bVar1 = false;
  }
LAB_007c1a5d:
  pDVar4 = pDVar6;
  if (((ulong)pDVar5 & 1) != 0) {
    pDVar5 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
    bVar1 = true;
    pDVar4 = pDVar8;
    pDVar8 = pDVar6;
  }
  bVar15 = ((ulong)pDVar8 & 1) != 0;
  pDVar9 = pDVar8;
  if (bVar15) {
    pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
    bVar1 = true;
    pDVar9 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
  }
  local_40 = (ulong)bVar15;
  if (bVar1) {
    f = pDVar5;
    h_00 = pDVar4;
    g_00 = pDVar9;
  }
  uVar12 = 0x7fffffff;
  uVar11 = 0x7fffffff;
  if ((ulong)pDVar5->index != 0x7fffffff) {
    uVar11 = dd->perm[pDVar5->index];
  }
  if ((ulong)pDVar9->index != 0x7fffffff) {
    uVar12 = dd->perm[pDVar9->index];
  }
  uVar10 = 0x7fffffff;
  if ((ulong)*(uint *)((ulong)pDVar4 & 0xfffffffffffffffe) != 0x7fffffff) {
    uVar10 = dd->perm[*(uint *)((ulong)pDVar4 & 0xfffffffffffffffe)];
  }
  pDVar4 = cuddConstantLookup(dd,0x6a,f,g_00,h_00);
  if (pDVar4 == (DdNode *)0x0) {
    uVar2 = uVar12;
    if (uVar10 < uVar12) {
      uVar2 = uVar10;
    }
    if (((uVar2 <= uVar11) || ((f->type).kids.T != pDVar3)) || ((f->type).kids.E != pDVar14)) {
      pDVar3 = f;
      pDVar14 = f;
      if (uVar11 <= uVar2) {
        pDVar3 = (f->type).kids.T;
        pDVar14 = (f->type).kids.E;
        uVar2 = uVar11;
      }
      pDVar4 = g_00;
      pDVar9 = g_00;
      if (uVar12 == uVar2) {
        pDVar4 = (g_00->type).kids.T;
        pDVar9 = (g_00->type).kids.E;
      }
      pDVar13 = h_00;
      pDVar6 = h_00;
      if (uVar10 == uVar2) {
        pDVar13 = *(DdNode **)(((ulong)h_00 & 0xfffffffffffffffe) + 0x10);
        pDVar6 = *(DdNode **)(((ulong)h_00 & 0xfffffffffffffffe) + 0x18);
        if (((ulong)h_00 & 1) != 0) {
          pDVar13 = (DdNode *)((ulong)pDVar13 ^ 1);
          pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
        }
      }
      pDVar13 = Cudd_bddIteConstant(dd,pDVar3,pDVar4,pDVar13);
      if (((pDVar13 == (DdNode *)0x1) ||
          (*(int *)((ulong)pDVar13 & 0xfffffffffffffffe) != 0x7fffffff)) ||
         ((pDVar3 = Cudd_bddIteConstant(dd,pDVar14,pDVar9,pDVar6), pDVar3 == (DdNode *)0x1 ||
          ((pDVar13 != pDVar3 || (*(int *)((ulong)pDVar3 & 0xfffffffffffffffe) != 0x7fffffff)))))) {
        pDVar13 = (DdNode *)0x1;
        cuddCacheInsert(dd,0x6a,f,g_00,h_00,(DdNode *)0x1);
      }
      else {
        cuddCacheInsert(dd,0x6a,f,g_00,h_00,pDVar13);
        pDVar13 = (DdNode *)(local_40 ^ (ulong)pDVar13);
      }
    }
  }
  else {
    local_50 = (byte)pDVar8;
    pDVar13 = (DdNode *)((ulong)(pDVar4 != (DdNode *)0x1 & local_50) ^ (ulong)pDVar4);
  }
  return pDVar13;
}

Assistant:

DdNode *
Cudd_bddIteConstant(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    DdNode       *one = DD_ONE(dd);
    DdNode       *zero = Cudd_Not(one);
    int          comple;
    unsigned int topf, topg, toph, v;

    statLine(dd);
    /* Trivial cases. */
    if (f == one)                       /* ITE(1,G,H) => G */
        return(g);
    
    if (f == zero)                      /* ITE(0,G,H) => H */
        return(h);
    
    /* f now not a constant. */
    bddVarToConst(f, &g, &h, one);      /* possibly convert g or h */
                                        /* to constants */

    if (g == h)                         /* ITE(F,G,G) => G */
        return(g);

    if (Cudd_IsConstant(g) && Cudd_IsConstant(h)) 
        return(DD_NON_CONSTANT);        /* ITE(F,1,0) or ITE(F,0,1) */
                                        /* => DD_NON_CONSTANT */
    
    if (g == Cudd_Not(h))
        return(DD_NON_CONSTANT);        /* ITE(F,G,G') => DD_NON_CONSTANT */
                                        /* if F != G and F != G' */
    
    comple = bddVarToCanonical(dd, &f, &g, &h, &topf, &topg, &toph);

    /* Cache lookup. */
    r = cuddConstantLookup(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple && r != DD_NON_CONSTANT));
    }

    v = ddMin(topg, toph);

    /* ITE(F,G,H) = (v,G,H) (non constant) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        return(DD_NON_CONSTANT);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);             /* v = top_var(F,G,H) */
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }

    if (topg == v) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }

    if (toph == v) {
        H = Cudd_Regular(h);
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursion. */
    t = Cudd_bddIteConstant(dd, Fv, Gv, Hv);
    if (t == DD_NON_CONSTANT || !Cudd_IsConstant(t)) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    e = Cudd_bddIteConstant(dd, Fnv, Gnv, Hnv);
    if (e == DD_NON_CONSTANT || !Cudd_IsConstant(e) || t != e) {
        cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    cuddCacheInsert(dd, DD_BDD_ITE_CONSTANT_TAG, f, g, h, t);
    return(Cudd_NotCond(t,comple));

}